

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O1

void HandleMbxTferReqError
               (CAtEmLogging *poLog,EC_T_CHAR *szErrMsg,EC_T_DWORD dwErrorCode,
               EC_T_MBXTFER *pMbxTfer)

{
  undefined8 uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = pMbxTfer->eTferStatus == eMbxTferStatus_Pend;
  if (bVar3) {
    iVar2 = -9;
    do {
      CAtEmLogging::LogError(poLog,"%s: waiting for mailbox transfer response",szErrMsg);
      LinuxSleep(2000);
      bVar3 = pMbxTfer->eTferStatus == eMbxTferStatus_Pend;
      if (!bVar3) break;
      bVar4 = iVar2 != 0;
      iVar2 = iVar2 + 1;
    } while (bVar4);
  }
  if (bVar3) {
    CAtEmLogging::LogError(poLog,"%s: timeout waiting for mailbox transfer response",szErrMsg);
  }
  if ((bool)(dwErrorCode == 0 | bVar3)) {
    return;
  }
  uVar1 = ecatGetText(dwErrorCode);
  CAtEmLogging::LogError(poLog,"%s: MbxTferReqError: %s (0x%lx)",szErrMsg,uVar1,(ulong)dwErrorCode);
  return;
}

Assistant:

EC_T_VOID HandleMbxTferReqError
    (CAtEmLogging* poLog
    ,EC_T_CHAR*    szErrMsg      /**< [in] error message */
    ,EC_T_DWORD    dwErrorCode   /**< [in] basic error code */
    ,EC_T_MBXTFER* pMbxTfer)     /**< [in] mbx transfer object */
{
    /* wait for MbxTfer completion, but let application finish if master never returns MbxTfer object (may happen using RAS) */
    {
        EC_T_DWORD dwWorstCaseTimeout = 10;

        /*
         * Wait if MbxTfer still running and MbxTfer object owned by master.
         * Cannot re-use MbxTfer object while state is eMbxTferStatus_Pend.
         */
        for (dwWorstCaseTimeout = 10; (eMbxTferStatus_Pend == pMbxTfer->eTferStatus) && (dwWorstCaseTimeout > 0); dwWorstCaseTimeout--)
        {
            LogErr("%s: waiting for mailbox transfer response", szErrMsg);
            OsSleep(2000);
        }

        if (eMbxTferStatus_Pend == pMbxTfer->eTferStatus)
        {
            LogErr("%s: timeout waiting for mailbox transfer response", szErrMsg);
            goto Exit;
        }
    }

    if (EC_E_NOERROR != dwErrorCode)
    {
        LogErr("%s: MbxTferReqError: %s (0x%lx)", szErrMsg, ecatGetText(dwErrorCode), dwErrorCode);
    }

Exit:
    return;
}